

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringNStd.cpp
# Opt level: O1

void testStringNStd(int iterations)

{
  usize *puVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  String blah [3];
  String local_f8;
  String local_d0;
  String local_a8;
  char **local_80;
  char *local_78;
  undefined8 local_70;
  undefined8 local_60;
  char **local_58;
  char *local_50;
  undefined8 local_48;
  undefined8 local_38;
  
  srand(100);
  local_a8.data = &local_a8._data;
  local_a8._data.ref = 0;
  local_a8._data.str =
       "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678";
  lVar3 = 0x50;
  local_a8._data.len = 0x50;
  local_80 = &local_78;
  local_60 = 0;
  local_78 = "12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688";
  local_70 = 0x50;
  local_58 = &local_50;
  local_38 = 0;
  local_50 = "12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698";
  local_48 = 0x50;
  if (0 < iterations) {
    do {
      local_f8._data.ref = 0;
      local_f8._data.str =
           "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678";
      local_f8._data.len = 0x50;
      local_f8.data = &local_f8._data;
      iVar2 = rand();
      if ((local_f8.data)->len == ((&local_a8)[iVar2 % 3].data)->len) {
        iVar2 = Memory::compare((local_f8.data)->str,((&local_a8)[iVar2 % 3].data)->str,
                                (local_f8.data)->len);
        bVar4 = iVar2 == 0;
      }
      else {
        bVar4 = false;
      }
      if ((local_f8.data)->ref != 0) {
        LOCK();
        puVar1 = &(local_f8.data)->ref;
        *puVar1 = *puVar1 - 1;
        UNLOCK();
        if ((*puVar1 == 0) && (local_f8.data != (Data *)0x0)) {
          operator_delete__(local_f8.data);
        }
      }
      if (bVar4) {
        local_d0.data = &local_d0._data;
        local_d0._data.ref = 0;
        local_d0._data.str =
             "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678";
        local_d0._data.len = 0x50;
        iVar2 = rand();
        String::operator+(&local_f8,&local_d0,&local_a8 + iVar2 % 3);
        if ((local_f8.data)->ref != 0) {
          LOCK();
          puVar1 = &(local_f8.data)->ref;
          *puVar1 = *puVar1 - 1;
          UNLOCK();
          if ((*puVar1 == 0) && (local_f8.data != (Data *)0x0)) {
            operator_delete__(local_f8.data);
          }
        }
        if ((local_d0.data)->ref != 0) {
          LOCK();
          puVar1 = &(local_d0.data)->ref;
          *puVar1 = *puVar1 - 1;
          UNLOCK();
          if ((*puVar1 == 0) && (local_d0.data != (Data *)0x0)) {
            operator_delete__(local_d0.data);
          }
        }
      }
      iterations = iterations + -1;
    } while (iterations != 0);
  }
  do {
    String::~String((String *)((long)&local_a8.data + lVar3));
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x28);
  return;
}

Assistant:

void testStringNStd(int iterations)
{
  srand(100);
  usize val = 0;
  String blah[] = {
    "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678",
    "12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688",
    "12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698"
  };
  for (int i = 0; i < iterations; ++i)
  {
    if(String("12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678") == blah[rand() % 3])
      val += (String("12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678") + blah[rand() % 3]).length();
  }
}